

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O1

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Paren_Expression(ChaiScript_Parser<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
                   *this)

{
  bool bVar1;
  bool bVar2;
  eval_error *peVar3;
  Depth_Counter dc;
  Depth_Counter local_50;
  string local_48;
  File_Position local_28;
  
  Depth_Counter::Depth_Counter(&local_50,this);
  bVar1 = Char(this,'(');
  if (bVar1) {
    bVar2 = Operator(this,0);
    if (!bVar2) {
      peVar3 = (eval_error *)__cxa_allocate_exception(0x90);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"Incomplete expression","");
      local_28.line = (this->m_position).line;
      local_28.column = (this->m_position).col;
      exception::eval_error::eval_error
                (peVar3,&local_48,&local_28,
                 (this->m_filename).
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
      __cxa_throw(peVar3,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
    }
    bVar2 = Char(this,')');
    if (!bVar2) {
      peVar3 = (eval_error *)__cxa_allocate_exception(0x90);
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"Missing closing parenthesis \')\'","");
      local_28.line = (this->m_position).line;
      local_28.column = (this->m_position).col;
      exception::eval_error::eval_error
                (peVar3,&local_48,&local_28,
                 (this->m_filename).
                 super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr);
      __cxa_throw(peVar3,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
    }
  }
  (local_50.parser)->m_current_parse_depth = (local_50.parser)->m_current_parse_depth - 1;
  return bVar1;
}

Assistant:

bool Paren_Expression() {
        Depth_Counter dc{this};
        if (Char('(')) {
          if (!Operator()) {
            throw exception::eval_error("Incomplete expression", File_Position(m_position.line, m_position.col), *m_filename);
          }
          if (!Char(')')) {
            throw exception::eval_error("Missing closing parenthesis ')'", File_Position(m_position.line, m_position.col), *m_filename);
          }
          return true;
        } else {
          return false;
        }
      }